

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall H264StreamReader::processSliceNal(H264StreamReader *this,uint8_t *buff)

{
  bool bVar1;
  int iVar2;
  SPSUnit *pSVar3;
  ostream *poVar4;
  PPSUnit *pPVar5;
  int64_t pts90k;
  undefined4 local_c0;
  int fullPicOrder;
  int local_ac;
  uint8_t *puStack_a8;
  int nalRez;
  uint8_t *sliceEnd;
  SliceUnit slice;
  uint8_t *buff_local;
  H264StreamReader *this_local;
  
  slice.sps = (SPSUnit *)buff;
  SliceUnit::SliceUnit((SliceUnit *)&sliceEnd);
  puStack_a8 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  local_ac = deserializeSliceHeader(this,(SliceUnit *)&sliceEnd,(uint8_t *)slice.sps,puStack_a8);
  if (((local_ac == 1) && ((this->m_isFirstFrame & 1U) != 0)) &&
     (bVar1 = findPPSForward(this,(uint8_t *)((long)&((slice.sps)->super_NALUnit)._vptr_NALUnit + 1)
                            ), bVar1)) {
    local_ac = deserializeSliceHeader(this,(SliceUnit *)&sliceEnd,(uint8_t *)slice.sps,puStack_a8);
  }
  if (local_ac == 0) {
    if (slice.non_idr_flag == 0) {
      if (this->m_fieldFirst == slice.pic_parameter_set_id) {
        iVar2 = detectPrimaryPicType(this,(SliceUnit *)&sliceEnd,(uint8_t *)slice.sps);
        if (iVar2 == 0) {
          pSVar3 = SliceUnit::getSPS((SliceUnit *)&sliceEnd);
          if (((pSVar3->frame_mbs_only_flag != 0) && (this->m_forceLsbDiv != 0)) &&
             ((uint)slice.frame_num % 2 == 1)) {
            if ((this->super_MPEGStreamReader).m_totalFrameNum < 0xfa) {
              this->m_forceLsbDiv = 0;
              poVar4 = std::operator<<((ostream *)&std::cerr,
                                       "H264 warn: Force frame_mbs_only_flag division invalid detected. Cancel this flag."
                                      );
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cerr,
                                       "H264 warn: Unexpected pic_order_cnt_lsb value ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,slice.frame_num);
              poVar4 = std::operator<<(poVar4,". FrameNum: ");
              poVar4 = (ostream *)
                       std::ostream::operator<<
                                 (poVar4,(this->super_MPEGStreamReader).m_totalFrameNum);
              poVar4 = std::operator<<(poVar4," slice type: ");
              poVar4 = std::operator<<(poVar4,sliceTypeStr
                                              [(uint)slice.memory_management_control_operation]);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            }
            sLastMsg = true;
          }
          pts90k._4_4_ = 0;
          pSVar3 = SliceUnit::getSPS((SliceUnit *)&sliceEnd);
          if (pSVar3->pic_order_cnt_type == 2) {
            this->m_frameDepth = 0;
          }
          else {
            pts90k._4_4_ = calcPicOrder(this,(SliceUnit *)&sliceEnd);
          }
          bVar1 = SliceUnit::isIDR((SliceUnit *)&sliceEnd);
          if (bVar1) {
            this->m_frameNum = 0;
            pSVar3 = SliceUnit::getSPS((SliceUnit *)&sliceEnd);
            if (pSVar3->pic_order_cnt_type == 2) {
              this->m_iFramePtsOffset = 0;
            }
            else {
              iVar2 = getIdrPrevFrames(this,(uint8_t *)slice.sps,
                                       (this->super_MPEGStreamReader).super_AbstractStreamReader.
                                       m_bufEnd);
              this->m_iFramePtsOffset = iVar2;
            }
            if (this->m_iFramePtsOffset == -1) {
              this_local._4_4_ = -10;
              goto LAB_0029e218;
            }
          }
          else {
            this->m_frameNum = this->m_frameNum + 1;
            pSVar3 = SliceUnit::getSPS((SliceUnit *)&sliceEnd);
            if (pSVar3->pic_order_cnt_type == 2) {
              pts90k._4_4_ = this->m_frameNum;
            }
          }
          pts90k._4_4_ = pts90k._4_4_ + this->m_iFramePtsOffset;
          this->m_isFirstFrame = false;
          (this->super_MPEGStreamReader).m_totalFrameNum =
               (this->super_MPEGStreamReader).m_totalFrameNum + 1;
          bVar1 = SliceUnit::isIDR((SliceUnit *)&sliceEnd);
          if (bVar1) {
            *(int *)&(this->super_MPEGStreamReader).field_0xdc =
                 *(int *)&(this->super_MPEGStreamReader).field_0xdc + 1;
            this->m_picOrderOffset = 0;
          }
          if (*(int *)&(this->super_MPEGStreamReader).field_0xdc == 0) {
            if (((this->m_bSliceFound & 1U) == 0) &&
               (slice.memory_management_control_operation == 1)) {
              this->m_bSliceFound = true;
              this->m_picOrderOffset = (this->m_frameNum - pts90k._4_4_) + -1;
            }
            if ((this->m_bSliceFound & 1U) == 0) {
              pts90k._4_4_ = this->m_frameNum;
            }
            else {
              pts90k._4_4_ = this->m_picOrderOffset + pts90k._4_4_;
              if (pts90k._4_4_ < 0) {
                pts90k._4_4_ = 0;
              }
            }
          }
          checkPyramid(this,this->m_frameNum,(int *)((long)&pts90k + 4),
                       (bool)((this->super_MPEGStreamReader).field_0xda & 1));
          (this->super_MPEGStreamReader).m_curDts =
               this->m_lastDtsInc + (this->super_MPEGStreamReader).m_curDts;
          (this->super_MPEGStreamReader).m_curPts =
               (this->super_MPEGStreamReader).m_curDts +
               (long)(pts90k._4_4_ - this->m_frameNum) *
               (this->super_MPEGStreamReader).m_pcrIncPerFrame;
          if (((this->super_MPEGStreamReader).m_curDts < (this->super_MPEGStreamReader).m_curPts) &&
             ((((this->super_MPEGStreamReader).field_0xda & 1) == 0 ||
              (((this->super_MPEGStreamReader).field_0xdb & 1) != 0)))) {
            (this->super_MPEGStreamReader).m_curPts = (this->super_MPEGStreamReader).m_curDts;
          }
          if (this->m_OffsetMetadataPtsAddr != (uint8_t *)0x0) {
            SEIUnit::updateMetadataPts
                      (this->m_OffsetMetadataPtsAddr,
                       (this->super_MPEGStreamReader).m_curDts / 0xe5b0 + this->m_startPts);
            this->m_OffsetMetadataPtsAddr = (uint8_t *)0x0;
          }
          if ((this->m_lastPicStruct == 5) || (this->m_lastPicStruct == 6)) {
            this->m_lastDtsInc =
                 (this->super_MPEGStreamReader).m_pcrIncPerFrame +
                 (this->super_MPEGStreamReader).m_pcrIncPerField;
          }
          else if (this->m_lastPicStruct == 7) {
            this->m_lastDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame << 1;
          }
          else if (this->m_lastPicStruct == 8) {
            this->m_lastDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame * 3;
          }
          else {
            this->m_lastDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
          }
          if (((this->super_MPEGStreamReader).m_removePulldown & 1U) != 0) {
            MPEGStreamReader::checkPulldownSync(&this->super_MPEGStreamReader);
            (this->super_MPEGStreamReader).m_testPulldownDts =
                 this->m_lastDtsInc + (this->super_MPEGStreamReader).m_testPulldownDts;
            this->m_lastDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
          }
          this->m_lastSlicePPS = slice.slice_type;
          pPVar5 = SliceUnit::getPPS((SliceUnit *)&sliceEnd);
          if (pPVar5 == (PPSUnit *)0x0) {
            this->m_lastSliceSPS = 0xffffffff;
          }
          else {
            pPVar5 = SliceUnit::getPPS((SliceUnit *)&sliceEnd);
            this->m_lastSliceSPS = pPVar5->seq_parameter_set_id;
          }
          bVar1 = SliceUnit::isIDR((SliceUnit *)&sliceEnd);
          this->m_lastSliceIDR = bVar1;
          bVar1 = SliceUnit::isIFrame((SliceUnit *)&sliceEnd);
          this->m_lastIFrame = bVar1;
          this_local._4_4_ = 0;
        }
        else {
          this_local._4_4_ = -10;
        }
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = local_ac;
  }
LAB_0029e218:
  local_c0 = 1;
  SliceUnit::~SliceUnit((SliceUnit *)&sliceEnd);
  return this_local._4_4_;
}

Assistant:

int H264StreamReader::processSliceNal(uint8_t *buff)
{
    SliceUnit slice;
    const uint8_t *sliceEnd = m_bufEnd;

    int nalRez = deserializeSliceHeader(slice, buff, sliceEnd);

    if (nalRez == NALUnit::SPS_OR_PPS_NOT_READY && m_isFirstFrame)
    {
        if (findPPSForward(buff + 1))
            nalRez = deserializeSliceHeader(slice, buff, sliceEnd);
    }

    if (nalRez != 0)
    {
        return nalRez;
    }

    if (slice.first_mb_in_slice != 0)
        return 0;

    if (m_fieldFirst != slice.bottom_field_flag)  // insrease PTS/DTS only for whole frame
        return 0;

    if (detectPrimaryPicType(slice, buff) != 0)
        return NOT_ENOUGH_BUFFER;

    // forceLsbDiv check
    if (slice.getSPS()->frame_mbs_only_flag && m_forceLsbDiv != 0)
    {
        if (slice.pic_order_cnt_lsb % 2 == 1)
        {
            if (m_totalFrameNum < 250)
            {
                m_forceLsbDiv = 0;
                LTRACE(LT_WARN, 2, "H264 warn: Force frame_mbs_only_flag division invalid detected. Cancel this flag.");
            }
            else
            {
                LTRACE(LT_WARN, 2,
                       "H264 warn: Unexpected pic_order_cnt_lsb value "
                           << slice.pic_order_cnt_lsb << ". FrameNum: " << m_totalFrameNum
                           << " slice type: " << sliceTypeStr[slice.slice_type]);
            }
        }
    }

    ////////////////////////////

    int fullPicOrder = 0;
    if (slice.getSPS()->pic_order_cnt_type != 2)
        fullPicOrder = calcPicOrder(slice);
    else
        m_frameDepth = 0;

    if (slice.isIDR())
    {
        // LTRACE(LT_INFO, 2, "got idr slice");
        m_frameNum = 0;
        if (slice.getSPS()->pic_order_cnt_type != 2)
            m_iFramePtsOffset = getIdrPrevFrames(buff, m_bufEnd);
        else
            m_iFramePtsOffset = 0;
        if (m_iFramePtsOffset == -1)
            return NOT_ENOUGH_BUFFER;
    }
    else
    {
        m_frameNum++;
        // m_frameNum = slice.frame_num;

        if (slice.getSPS()->pic_order_cnt_type == 2)
            fullPicOrder = m_frameNum;
    }
    fullPicOrder += m_iFramePtsOffset;

    m_isFirstFrame = false;
    m_totalFrameNum++;

    if (slice.isIDR())
    {
        m_idrSliceCnt++;
        m_picOrderOffset = 0;
    }
    if (m_idrSliceCnt == 0)
    {
        if (!m_bSliceFound && slice.slice_type == SliceUnit::B_TYPE)
        {
            m_bSliceFound = true;
            m_picOrderOffset = m_frameNum - fullPicOrder - 1;
        }
        if (m_bSliceFound)
        {
            fullPicOrder += m_picOrderOffset;
            if (fullPicOrder < 0)
                fullPicOrder = 0;
        }
        else
            fullPicOrder = m_frameNum;
    }

    // check b-pyramid
    checkPyramid(m_frameNum, &fullPicOrder, m_nextFrameFound);

    // increase PTS/DTS
    m_curDts += m_lastDtsInc;
    m_curPts = m_curDts + (fullPicOrder - m_frameNum) * m_pcrIncPerFrame;

    if (m_curPts > m_curDts && (!m_nextFrameFound || m_nextFrameIdr))
        m_curPts = m_curDts;

    if (m_OffsetMetadataPtsAddr)
    {
        const auto pts90k = m_curDts / INT_FREQ_TO_TS_FREQ + m_startPts;
        SEIUnit::updateMetadataPts(m_OffsetMetadataPtsAddr, pts90k);
        m_OffsetMetadataPtsAddr = nullptr;
    }
    // LTRACE(LT_INFO, 2, "delta=" << fullPicOrder - m_frameNum << " m_lastDtsInc=" << m_lastDtsInc);

    if (m_lastPicStruct == 5 || m_lastPicStruct == 6)  // 3 fields per frame. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame + m_pcrIncPerField;
    else if (m_lastPicStruct == 7)  // frame doubling. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame * 2;
    else if (m_lastPicStruct == 8)  // frame tripling. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame * 3;
    else
        m_lastDtsInc = m_pcrIncPerFrame;

    if (m_removePulldown)
    {
        checkPulldownSync();
        m_testPulldownDts += m_lastDtsInc;
        m_lastDtsInc = m_pcrIncPerFrame;
    }

    m_lastSlicePPS = slice.pic_parameter_set_id;
    if (slice.getPPS() != nullptr)
        m_lastSliceSPS = slice.getPPS()->seq_parameter_set_id;
    else
        m_lastSliceSPS = -1;
    m_lastSliceIDR = slice.isIDR();
    m_lastIFrame = slice.isIFrame();

    return 0;
}